

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O0

void __thiscall SortableOIDType::~SortableOIDType(SortableOIDType *this)

{
  SortableOIDType *this_local;
  
  (this->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
       (_func_int **)&PTR__SortableOIDType_0028dd98;
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            (&this->sortingMap);
  OIDType::~OIDType(&this->super_OIDType);
  return;
}

Assistant:

explicit SortableOIDType(const std::string& value): OIDType(value), sortingMap(generateSortingMap()){}